

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O1

bool flatbuffers::java::SaveClass(Parser *parser,Definition *def,string *classcode,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined1 *puVar3;
  char cVar4;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  pointer pbVar8;
  bool bVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename;
  string code;
  string name_space_dir;
  string name_space_java;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  undefined1 *local_2c0 [2];
  undefined1 local_2b0 [16];
  char *local_2a0;
  long local_298;
  char local_290 [16];
  Definition *local_280;
  string *local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  if (classcode->_M_string_length == 0) {
    bVar9 = true;
  }
  else {
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    local_270._M_string_length = 0;
    local_270.field_2._M_local_buf[0] = '\0';
    local_2a0 = local_290;
    pcVar2 = (path->_M_dataplus)._M_p;
    local_280 = def;
    local_278 = classcode;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar2,pcVar2 + path->_M_string_length);
    pbVar8 = (parser->name_space_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar8 != (parser->name_space_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        if (local_270._M_string_length != 0) {
          std::__cxx11::string::append((char *)&local_270);
          std::__cxx11::string::append((char *)&local_2a0);
        }
        std::__cxx11::string::_M_append((char *)&local_270,(ulong)(pbVar8->_M_dataplus)._M_p);
        std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)(pbVar8->_M_dataplus)._M_p);
        mkdir(local_2a0,0x1ed);
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 != (parser->name_space_).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    local_2c0[0] = local_2b0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2c0,"// automatically generated, do not modify\n\n","");
    std::operator+(&local_2e0,"package ",&local_270);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_2e0);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_220 = *plVar6;
      lStack_218 = plVar5[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *plVar6;
      local_230 = (long *)*plVar5;
    }
    local_228 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_2c0,(ulong)local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230);
    }
    paVar1 = &local_2e0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    std::__cxx11::string::append((char *)local_2c0);
    std::__cxx11::string::append((char *)local_2c0);
    std::__cxx11::string::_M_append((char *)local_2c0,(ulong)(local_278->_M_dataplus)._M_p);
    local_250[0] = local_240;
    std::__cxx11::string::_M_construct<char*>((string *)local_250,local_2a0,local_2a0 + local_298);
    std::__cxx11::string::append((char *)local_250);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_250,(ulong)(local_280->name)._M_dataplus._M_p);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_220 = *plVar6;
      lStack_218 = plVar5[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *plVar6;
      local_230 = (long *)*plVar5;
    }
    local_228 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_230);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_2e0.field_2._M_allocated_capacity = *psVar7;
      local_2e0.field_2._8_8_ = plVar5[3];
      local_2e0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_2e0.field_2._M_allocated_capacity = *psVar7;
      local_2e0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_2e0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_230 != &local_220) {
      operator_delete(local_230);
    }
    if (local_250[0] != local_240) {
      operator_delete(local_250[0]);
    }
    puVar3 = local_2c0[0];
    std::ofstream::ofstream(&local_230,local_2e0._M_dataplus._M_p,_S_out);
    cVar4 = std::__basic_file<char>::is_open();
    if (cVar4 == '\0') {
      bVar9 = false;
    }
    else {
      std::ostream::write((char *)&local_230,(long)puVar3);
      bVar9 = (abStack_210[local_230[-3]] & 1) == 0;
    }
    local_230 = _VTT;
    *(undefined8 *)((long)&local_230 + _VTT[-3]) = _memcpy;
    std::filebuf::~filebuf((filebuf *)&local_228);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    if (local_2c0[0] != local_2b0) {
      operator_delete(local_2c0[0]);
    }
    if (local_2a0 != local_290) {
      operator_delete(local_2a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p);
    }
  }
  return bVar9;
}

Assistant:

static bool SaveClass(const Parser &parser, const Definition &def,
                      const std::string &classcode, const std::string &path) {
  if (!classcode.length()) return true;

  std::string name_space_java;
  std::string name_space_dir = path;
  for (auto it = parser.name_space_.begin();
        it != parser.name_space_.end(); ++it) {
    if (name_space_java.length()) {
      name_space_java += ".";
      name_space_dir += PATH_SEPARATOR;
    }
    name_space_java += *it;
    name_space_dir += *it;
    mkdir(name_space_dir.c_str(), S_IRWXU|S_IRGRP|S_IXGRP|S_IROTH|S_IXOTH);
  }

  std::string code = "// automatically generated, do not modify\n\n";
  code += "package " + name_space_java + ";\n\n";
  code += "import java.nio.*;\nimport java.lang.*;\nimport java.util.*;\n";
  code += "import flatbuffers.*;\n\n";
  code += classcode;
  auto filename = name_space_dir + PATH_SEPARATOR + def.name + ".java";
  return SaveFile(filename.c_str(), code, false);
}